

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_network.cpp
# Opt level: O1

void __thiscall sensors_analytics::Connection::~Connection(Connection *this)

{
  pointer pcVar1;
  
  if (this->curl_handle_ != (CURL *)0x0) {
    curl_easy_cleanup();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->header_fields_)._M_t);
  pcVar1 = (this->base_url_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->base_url_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Connection::~Connection() {
  if (this->curl_handle_) {
    curl_easy_cleanup(this->curl_handle_);
  }
}